

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O0

void __thiscall
S2LatLngRectBounder::AddInternal(S2LatLngRectBounder *this,S2Point *b,S2LatLng *b_latlng)

{
  S2LatLngRect *__return_storage_ptr__;
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  FloatType FVar7;
  S2LatLngRect local_278;
  S2LatLngRect local_250;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double max_delta;
  double local_1f0;
  double lat_budget;
  double local_1e0;
  double local_1d8;
  double max_lat;
  double m_error;
  double m_b;
  double m_a;
  undefined1 local_1a0 [8];
  Vector3_d m;
  S1Angle local_180;
  undefined1 local_178 [8];
  R1Interval lat_ab;
  S1Angle local_158;
  S1Angle local_150;
  undefined1 local_148 [8];
  S1Interval lng_ab;
  S2LatLngRect local_110;
  S2LatLngRect local_e8;
  FloatType local_c0;
  double n_norm;
  D local_a0;
  undefined1 local_88 [8];
  Vector3_d n;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  double local_40;
  S2Point local_38;
  S2LatLng *local_20;
  S2LatLng *b_latlng_local;
  S2Point *b_local;
  S2LatLngRectBounder *this_local;
  
  local_20 = b_latlng;
  b_latlng_local = (S2LatLng *)b;
  b_local = &this->a_;
  S2LatLng::ToPoint(&local_38,b_latlng);
  local_40 = (double)S1Angle::Radians(1e-15);
  bVar2 = S2::ApproxEquals(b,&local_38,(S1Angle)local_40);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_58);
    poVar3 = std::operator<<(poVar3,"Check failed: S2::ApproxEquals(b, b_latlng.ToPoint()) ");
    S2LogMessageVoidify::operator&(&local_41,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  bVar2 = S2LatLngRect::is_empty(&this->bound_);
  if (bVar2) {
    S2LatLngRect::AddPoint(&this->bound_,local_20);
  }
  else {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_a0,(BasicVector<Vector3,_double,_3UL> *)this,(D *)b_latlng_local);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
              ((D *)&n_norm,(BasicVector<Vector3,_double,_3UL> *)this,(D *)b_latlng_local);
    Vector3<double>::CrossProd((Vector3<double> *)local_88,&local_a0,(Vector3<double> *)&n_norm);
    local_c0 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                         ((BasicVector<Vector3,_double,_3UL> *)local_88);
    if (1.91346e-15 <= local_c0) {
      local_150 = S2LatLng::lng(&this->a_latlng_);
      dVar5 = S1Angle::radians(&local_150);
      local_158 = S2LatLng::lng(local_20);
      dVar6 = S1Angle::radians(&local_158);
      _local_148 = S1Interval::FromPointPair(dVar5,dVar6);
      dVar5 = S1Interval::GetLength((S1Interval *)local_148);
      if (3.1415926535897927 <= dVar5) {
        join_0x00001240_0x00001200_ = S1Interval::Full();
        _local_148 = join_0x00001240_0x00001200_;
      }
      local_180 = S2LatLng::lat(&this->a_latlng_);
      dVar5 = S1Angle::radians(&local_180);
      m.c_[2] = (VType)S2LatLng::lat(local_20);
      dVar6 = S1Angle::radians((S1Angle *)(m.c_ + 2));
      _local_178 = R1Interval::FromPointPair(dVar5,dVar6);
      Vector3<double>::Vector3((Vector3<double> *)&m_a,0.0,0.0,1.0);
      Vector3<double>::CrossProd
                ((Vector3<double> *)local_1a0,(Vector3<double> *)local_88,(Vector3<double> *)&m_a);
      m_b = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)local_1a0,&this->a_);
      m_error = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)local_1a0,(D *)b_latlng_local);
      max_lat = local_c0 * 6.06638e-16 + 6.83174e-31;
      if (((m_b * m_error < 0.0) || (ABS(m_b) <= max_lat)) || (ABS(m_error) <= max_lat)) {
        pdVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                           ((BasicVector<Vector3,_double,_3UL> *)local_88,0);
        dVar5 = *pdVar4;
        pdVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                           ((BasicVector<Vector3,_double,_3UL> *)local_88,0);
        dVar6 = *pdVar4;
        pdVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                           ((BasicVector<Vector3,_double,_3UL> *)local_88,1);
        dVar1 = *pdVar4;
        pdVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                           ((BasicVector<Vector3,_double,_3UL> *)local_88,1);
        dVar5 = sqrt(dVar5 * dVar6 + dVar1 * *pdVar4);
        pdVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                           ((BasicVector<Vector3,_double,_3UL> *)local_88,2);
        local_1e0 = atan2(dVar5,ABS(*pdVar4));
        local_1e0 = local_1e0 + 6.661338147750939e-16;
        lat_budget = 1.5707963267948966;
        pdVar4 = std::min<double>(&local_1e0,&lat_budget);
        local_1d8 = *pdVar4;
        util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
                  ((D *)&max_delta,(BasicVector<Vector3,_double,_3UL> *)this,(D *)b_latlng_local);
        FVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                          ((BasicVector<Vector3,_double,_3UL> *)&max_delta);
        dVar5 = sin(local_1d8);
        dVar5 = asin(FVar7 * 0.5 * dVar5);
        local_1f0 = dVar5 * 2.0;
        dVar6 = R1Interval::GetLength((R1Interval *)local_178);
        local_210 = (dVar5 * 2.0 - dVar6) * 0.5 + 2.220446049250313e-16;
        if ((m_b <= max_lat) && (-max_lat <= m_error)) {
          local_218 = R1Interval::hi((R1Interval *)local_178);
          local_218 = local_218 + local_210;
          pdVar4 = std::min<double>(&local_1d8,&local_218);
          R1Interval::set_hi((R1Interval *)local_178,*pdVar4);
        }
        if ((m_error <= max_lat) && (-max_lat <= m_b)) {
          local_220 = -local_1d8;
          local_228 = R1Interval::lo((R1Interval *)local_178);
          local_228 = local_228 - local_210;
          pdVar4 = std::max<double>(&local_220,&local_228);
          R1Interval::set_lo((R1Interval *)local_178,*pdVar4);
        }
      }
      S2LatLngRect::S2LatLngRect(&local_278,(R1Interval *)local_178,(S1Interval *)local_148);
      S2LatLngRect::Union(&local_250,&this->bound_,&local_278);
      S2LatLngRect::operator=(&this->bound_,&local_250);
      S2LatLngRect::~S2LatLngRect(&local_250);
      S2LatLngRect::~S2LatLngRect(&local_278);
    }
    else {
      dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)this,(D *)b_latlng_local);
      if (0.0 <= dVar5) {
        __return_storage_ptr__ = (S2LatLngRect *)(lng_ab.bounds_.c_ + 1);
        S2LatLngRect::FromPointPair(__return_storage_ptr__,&this->a_latlng_,local_20);
        S2LatLngRect::Union(&local_110,&this->bound_,__return_storage_ptr__);
        S2LatLngRect::operator=(&this->bound_,&local_110);
        S2LatLngRect::~S2LatLngRect(&local_110);
        S2LatLngRect::~S2LatLngRect((S2LatLngRect *)(lng_ab.bounds_.c_ + 1));
      }
      else {
        S2LatLngRect::Full();
        S2LatLngRect::operator=(&this->bound_,&local_e8);
        S2LatLngRect::~S2LatLngRect(&local_e8);
      }
    }
  }
  (this->a_).c_[0] = (b_latlng_local->coords_).c_[0];
  (this->a_).c_[1] = (b_latlng_local->coords_).c_[1];
  (this->a_).c_[2] = b_latlng_local[1].coords_.c_[0];
  (this->a_latlng_).coords_.c_[0] = (local_20->coords_).c_[0];
  (this->a_latlng_).coords_.c_[1] = (local_20->coords_).c_[1];
  return;
}

Assistant:

void S2LatLngRectBounder::AddInternal(const S2Point& b,
                                      const S2LatLng& b_latlng) {
  // Simple consistency check to verify that b and b_latlng are alternate
  // representations of the same vertex.
  S2_DCHECK(S2::ApproxEquals(b, b_latlng.ToPoint()));

  if (bound_.is_empty()) {
    bound_.AddPoint(b_latlng);
  } else {
    // First compute the cross product N = A x B robustly.  This is the normal
    // to the great circle through A and B.  We don't use S2::RobustCrossProd()
    // since that method returns an arbitrary vector orthogonal to A if the two
    // vectors are proportional, and we want the zero vector in that case.
    Vector3_d n = (a_ - b).CrossProd(a_ + b);  // N = 2 * (A x B)

    // The relative error in N gets large as its norm gets very small (i.e.,
    // when the two points are nearly identical or antipodal).  We handle this
    // by choosing a maximum allowable error, and if the error is greater than
    // this we fall back to a different technique.  Since it turns out that
    // the other sources of error in converting the normal to a maximum
    // latitude add up to at most 1.16 * DBL_EPSILON (see below), and it is
    // desirable to have the total error be a multiple of DBL_EPSILON, we have
    // chosen to limit the maximum error in the normal to 3.84 * DBL_EPSILON.
    // It is possible to show that the error is less than this when
    //
    //   n.Norm() >= 8 * sqrt(3) / (3.84 - 0.5 - sqrt(3)) * DBL_EPSILON
    //            = 1.91346e-15 (about 8.618 * DBL_EPSILON)
    double n_norm = n.Norm();
    if (n_norm < 1.91346e-15) {
      // A and B are either nearly identical or nearly antipodal (to within
      // 4.309 * DBL_EPSILON, or about 6 nanometers on the earth's surface).
      if (a_.DotProd(b) < 0) {
        // The two points are nearly antipodal.  The easiest solution is to
        // assume that the edge between A and B could go in any direction
        // around the sphere.
        bound_ = S2LatLngRect::Full();
      } else {
        // The two points are nearly identical (to within 4.309 * DBL_EPSILON).
        // In this case we can just use the bounding rectangle of the points,
        // since after the expansion done by GetBound() this rectangle is
        // guaranteed to include the (lat,lng) values of all points along AB.
        bound_ = bound_.Union(S2LatLngRect::FromPointPair(a_latlng_, b_latlng));
      }
    } else {
      // Compute the longitude range spanned by AB.
      S1Interval lng_ab = S1Interval::FromPointPair(a_latlng_.lng().radians(),
                                                    b_latlng.lng().radians());
      if (lng_ab.GetLength() >= M_PI - 2 * DBL_EPSILON) {
        // The points lie on nearly opposite lines of longitude to within the
        // maximum error of the calculation.  (Note that this test relies on
        // the fact that M_PI is slightly less than the true value of Pi, and
        // that representable values near M_PI are 2 * DBL_EPSILON apart.)
        // The easiest solution is to assume that AB could go on either side
        // of the pole.
        lng_ab = S1Interval::Full();
      }

      // Next we compute the latitude range spanned by the edge AB.  We start
      // with the range spanning the two endpoints of the edge:
      R1Interval lat_ab = R1Interval::FromPointPair(a_latlng_.lat().radians(),
                                                    b_latlng.lat().radians());

      // This is the desired range unless the edge AB crosses the plane
      // through N and the Z-axis (which is where the great circle through A
      // and B attains its minimum and maximum latitudes).  To test whether AB
      // crosses this plane, we compute a vector M perpendicular to this
      // plane and then project A and B onto it.
      Vector3_d m = n.CrossProd(S2Point(0, 0, 1));
      double m_a = m.DotProd(a_);
      double m_b = m.DotProd(b);

      // We want to test the signs of "m_a" and "m_b", so we need to bound
      // the error in these calculations.  It is possible to show that the
      // total error is bounded by
      //
      //  (1 + sqrt(3)) * DBL_EPSILON * n_norm + 8 * sqrt(3) * (DBL_EPSILON**2)
      //    = 6.06638e-16 * n_norm + 6.83174e-31

      double m_error = 6.06638e-16 * n_norm + 6.83174e-31;
      if (m_a * m_b < 0 || fabs(m_a) <= m_error || fabs(m_b) <= m_error) {
        // Minimum/maximum latitude *may* occur in the edge interior.
        //
        // The maximum latitude is 90 degrees minus the latitude of N.  We
        // compute this directly using atan2 in order to get maximum accuracy
        // near the poles.
        //
        // Our goal is compute a bound that contains the computed latitudes of
        // all S2Points P that pass the point-in-polygon containment test.
        // There are three sources of error we need to consider:
        //  - the directional error in N (at most 3.84 * DBL_EPSILON)
        //  - converting N to a maximum latitude
        //  - computing the latitude of the test point P
        // The latter two sources of error are at most 0.955 * DBL_EPSILON
        // individually, but it is possible to show by a more complex analysis
        // that together they can add up to at most 1.16 * DBL_EPSILON, for a
        // total error of 5 * DBL_EPSILON.
        //
        // We add 3 * DBL_EPSILON to the bound here, and GetBound() will pad
        // the bound by another 2 * DBL_EPSILON.
        double max_lat = min(
            atan2(sqrt(n[0]*n[0] + n[1]*n[1]), fabs(n[2])) + 3 * DBL_EPSILON,
            M_PI_2);

        // In order to get tight bounds when the two points are close together,
        // we also bound the min/max latitude relative to the latitudes of the
        // endpoints A and B.  First we compute the distance between A and B,
        // and then we compute the maximum change in latitude between any two
        // points along the great circle that are separated by this distance.
        // This gives us a latitude change "budget".  Some of this budget must
        // be spent getting from A to B; the remainder bounds the round-trip
        // distance (in latitude) from A or B to the min or max latitude
        // attained along the edge AB.
        double lat_budget = 2 * asin(0.5 * (a_ - b).Norm() * sin(max_lat));
        double max_delta = 0.5*(lat_budget - lat_ab.GetLength()) + DBL_EPSILON;

        // Test whether AB passes through the point of maximum latitude or
        // minimum latitude.  If the dot product(s) are small enough then the
        // result may be ambiguous.
        if (m_a <= m_error && m_b >= -m_error) {
          lat_ab.set_hi(min(max_lat, lat_ab.hi() + max_delta));
        }
        if (m_b <= m_error && m_a >= -m_error) {
          lat_ab.set_lo(max(-max_lat, lat_ab.lo() - max_delta));
        }
      }
      bound_ = bound_.Union(S2LatLngRect(lat_ab, lng_ab));
    }
  }
  a_ = b;
  a_latlng_ = b_latlng;
}